

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_libapi.cpp
# Opt level: O0

ze_result_t
zeInitDrivers(uint32_t *pCount,ze_driver_handle_t *phDrivers,ze_init_driver_type_desc_t *desc)

{
  ze_pfnInitDrivers_t p_Var1;
  __pointer_type p_Var2;
  ze_pfnInitDrivers_t pfnInitDrivers;
  ze_result_t *local_38;
  ze_result_t local_2c;
  ze_init_driver_type_desc_t *pzStack_28;
  ze_result_t result;
  ze_init_driver_type_desc_t *desc_local;
  ze_driver_handle_t *phDrivers_local;
  uint32_t *pCount_local;
  
  local_2c = ZE_RESULT_SUCCESS;
  local_38 = &local_2c;
  pfnInitDrivers = (ze_pfnInitDrivers_t)desc;
  pzStack_28 = desc;
  desc_local = (ze_init_driver_type_desc_t *)phDrivers;
  phDrivers_local = (ze_driver_handle_t *)pCount;
  std::call_once<zeInitDrivers::__0>
            ((once_flag *)(ze_lib::context + 4),(anon_class_16_2_5045e685 *)&pfnInitDrivers);
  if (local_2c == ZE_RESULT_SUCCESS) {
    if ((ze_lib::destruction & 1) == 0) {
      p_Var2 = std::atomic<_ze_dditable_t_*>::load
                         ((atomic<_ze_dditable_t_*> *)(ze_lib::context + 0x10),memory_order_seq_cst)
      ;
      p_Var1 = (p_Var2->Global).pfnInitDrivers;
      if (p_Var1 == (ze_pfnInitDrivers_t)0x0) {
        if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
          pCount_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
        }
        else {
          pCount_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
      }
      else {
        pCount_local._4_4_ =
             (*p_Var1)((uint32_t *)phDrivers_local,(ze_driver_handle_t *)desc_local,pzStack_28);
        if ((pCount_local._4_4_ == ZE_RESULT_SUCCESS) &&
           (desc_local != (ze_init_driver_type_desc_t *)0x0)) {
          *(undefined1 *)(ze_lib::context + 0xd92) = 1;
        }
      }
    }
    else {
      pCount_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
    }
  }
  else {
    pCount_local._4_4_ = local_2c;
  }
  return pCount_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zeInitDrivers(
    uint32_t* pCount,                               ///< [in,out] pointer to the number of driver instances.
                                                    ///< if count is zero, then the loader shall update the value with the
                                                    ///< total number of drivers available.
                                                    ///< if count is greater than the number of drivers available, then the
                                                    ///< loader shall update the value with the correct number of drivers available.
    ze_driver_handle_t* phDrivers,                  ///< [in,out][optional][range(0, *pCount)] array of driver instance handles.
                                                    ///< if count is less than the number of drivers available, then the loader
                                                    ///< shall only retrieve that number of drivers.
    ze_init_driver_type_desc_t* desc                ///< [in] descriptor containing the driver type initialization details
                                                    ///< including ::ze_init_driver_type_flag_t combinations.
    )
{
    ze_result_t result = ZE_RESULT_SUCCESS;
    #ifdef DYNAMIC_LOAD_LOADER
    if (!ze_lib::context) {
        ze_lib::context = new ze_lib::context_t;
    }
    #endif
    std::call_once(ze_lib::context->initOnceDrivers, [desc,&result]() {
        result = ze_lib::context->Init(0, false, desc);
        return result;
    });

    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }

    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnInitDrivers = ze_lib::context->zeDdiTable.load()->Global.pfnInitDrivers;
    if( nullptr == pfnInitDrivers ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    result = pfnInitDrivers( pCount, phDrivers, desc );

    if (result == ZE_RESULT_SUCCESS) {
        if (phDrivers) {
            ze_lib::context->zeInuse = true;
        }
    }

    return result;
}